

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<int> __thiscall
deqp::gls::BuiltinPrecisionTests::exprP<int>(BuiltinPrecisionTests *this,Expr<int> *ptr)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<int> EVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_> local_28;
  Expr<int> *local_18;
  Expr<int> *ptr_local;
  
  local_18 = ptr;
  ptr_local = (Expr<int> *)this;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>::SharedPtr(&local_28,ptr);
  exprP<int>(this,&local_28);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>::~SharedPtr(&local_28);
  EVar1.super_ExprPBase<int>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>.
  m_state = extraout_RDX;
  EVar1.super_ExprPBase<int>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>.
  m_ptr = (Expr<int> *)this;
  return (ExprP<int>)
         EVar1.super_ExprPBase<int>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<int>_>;
}

Assistant:

ExprP<T> exprP (const Expr<T>* ptr)
{
	return exprP(SharedPtr<const Expr<T> >(ptr));
}